

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

QArrayDataPointer<char16_t> * __thiscall
QArrayDataPointer<char16_t>::sliced(QArrayDataPointer<char16_t> *this,qsizetype pos,qsizetype n)

{
  bool bVar1;
  char16_t *pcVar2;
  long in_RCX;
  QArrayDataPointer<char16_t> *in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  qsizetype unaff_retaddr;
  QArrayDataPointer<char16_t> *in_stack_00000008;
  char16_t *newBeginning;
  char16_t *in_stack_ffffffffffffffb8;
  char16_t *__last;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  QArrayDataPointer<char16_t> *n_00;
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  n_00 = in_RDI;
  bVar1 = needsDetach(in_RDI);
  if (bVar1) {
    sliced(in_stack_00000008,unaff_retaddr,(qsizetype)n_00);
  }
  else {
    pcVar2 = begin((QArrayDataPointer<char16_t> *)0x530366);
    pcVar2 = pcVar2 + (long)in_RDX;
    begin((QArrayDataPointer<char16_t> *)0x530380);
    std::destroy<char16_t*>((char16_t *)this_00,in_stack_ffffffffffffffb8);
    __last = pcVar2 + in_RCX;
    end(this_00);
    std::destroy<char16_t*>((char16_t *)this_00,__last);
    setBegin(in_RSI,pcVar2);
    in_RSI->size = in_RCX;
    QArrayDataPointer(this_01,in_RDX);
  }
  return in_RDI;
}

Assistant:

QArrayDataPointer sliced(qsizetype pos, qsizetype n) &&
    {
        if (needsDetach())
            return sliced(pos, n);
        T *newBeginning = begin() + pos;
        std::destroy(begin(), newBeginning);
        std::destroy(newBeginning + n, end());
        setBegin(newBeginning);
        size = n;
        return std::move(*this);
    }